

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_operator_suite.cpp
# Opt level: O0

void addition_suite::add_real_with_boolean(void)

{
  undefined8 local_90;
  type_conflict9 local_88;
  undefined1 local_7f;
  undefined1 local_7e [21];
  bool local_69;
  basic_variable<std::allocator<char>_> local_68;
  undefined1 local_38 [8];
  basic_variable<std::allocator<char>_> data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_68,3.0);
  local_69 = true;
  trial::dynamic::operator+((basic_variable<std::allocator<char>_> *)local_38,&local_68,&local_69);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_68);
  local_7e[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<float>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_7f = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<float>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x9d4,"void addition_suite::add_real_with_boolean()",local_7e,&local_7f);
  local_88 = trial::dynamic::basic_variable<std::allocator<char>_>::value<double>
                       ((basic_variable<std::allocator<char>_> *)local_38);
  local_90 = 0x4010000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("data.value<double>()","4.0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x9d5,"void addition_suite::add_real_with_boolean()",&local_88,&local_90);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  return;
}

Assistant:

void add_real_with_boolean()
{
    auto data = variable(3.0) + true;
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<float>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.value<double>(), 4.0);
}